

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::AliasingBarrier
          (DeviceContextVkImpl *this,IDeviceObject *pResourceBefore,IDeviceObject *pResourceAfter)

{
  BIND_FLAGS BVar1;
  IDeviceObject *pResource;
  VkPipelineStageFlags vkSrcStages;
  VkAccessFlags vkDstAccessMask;
  VkPipelineStageFlags vkDstStages;
  VkAccessFlags vkSrcAccessMask;
  IDeviceObject local_40;
  VkPipelineStageFlags local_38;
  VkAccessFlags local_34;
  
  pResource = &local_40;
  local_40.super_IObject._vptr_IObject._0_4_ = 0;
  local_34 = 0;
  BVar1 = AliasingBarrier::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)pResourceBefore,pResourceBefore);
  GetAllowedStagesAndAccessMask(BVar1,(VkPipelineStageFlags *)pResource,&local_34);
  local_38 = 0;
  local_40.super_IObject._vptr_IObject._4_4_ = 0;
  BVar1 = AliasingBarrier::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)pResourceAfter,pResource);
  GetAllowedStagesAndAccessMask
            (BVar1,&local_38,(VkAccessFlags *)((long)&local_40.super_IObject._vptr_IObject + 4));
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
            (&this->m_CommandBuffer,local_34,local_40.super_IObject._vptr_IObject._4_4_,
             (VkPipelineStageFlags)local_40.super_IObject._vptr_IObject,local_38);
  return;
}

Assistant:

void DeviceContextVkImpl::AliasingBarrier(IDeviceObject* pResourceBefore, IDeviceObject* pResourceAfter)
{
    auto GetResourceBindFlags = [](IDeviceObject* pResource) //
    {
        if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
        {
            return pTexture.RawPtr<TextureVkImpl>()->GetDesc().BindFlags;
        }
        else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
        {
            return pBuffer.RawPtr<BufferVkImpl>()->GetDesc().BindFlags;
        }
        else
        {
            constexpr BIND_FLAGS BindAll = static_cast<BIND_FLAGS>((Uint32{BIND_FLAG_LAST} << 1) - 1);
            return BindAll;
        }
    };

    VkPipelineStageFlags vkSrcStages     = 0;
    VkAccessFlags        vkSrcAccessMask = 0;
    GetAllowedStagesAndAccessMask(GetResourceBindFlags(pResourceBefore), vkSrcStages, vkSrcAccessMask);

    VkPipelineStageFlags vkDstStages     = 0;
    VkAccessFlags        vkDstAccessMask = 0;
    GetAllowedStagesAndAccessMask(GetResourceBindFlags(pResourceAfter), vkDstStages, vkDstAccessMask);

    EnsureVkCmdBuffer();
    m_CommandBuffer.MemoryBarrier(vkSrcAccessMask, vkDstAccessMask, vkSrcStages, vkDstStages);
}